

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O2

void __thiscall Am_Drawonable_Impl::Allocate_Closest_Color(Am_Drawonable_Impl *this,XColor *c)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong *puVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  ushort *puVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int n;
  XVisualInfo vit;
  
  iVar2 = XAllocColor(this->screen->display,this->screen->colormap,c);
  if (iVar2 == 0) {
    if (Allocate_Closest_Color(XColor&)::flag == '\0') {
      std::operator<<((ostream *)&std::cerr,"** No color cells left; using closest match.\n");
      Allocate_Closest_Color(XColor&)::flag = '\x01';
    }
    vit.visualid = XVisualIDFromVisual(*(undefined8 *)
                                        (*(long *)(this->screen->display + 0xe8) + 0x40 +
                                        (long)this->screen->screen_number * 0x80));
    uVar11 = 1;
    lVar3 = XGetVisualInfo(this->screen->display,1,&vit,&n);
    if (n == 0) {
      std::operator<<((ostream *)&std::cerr,
                      "** X Error finding closest color match.  Using Black instead.\n");
      XFree(lVar3);
      Paint_It_Black(c,this->screen->display,this->screen->colormap);
    }
    else {
      uVar1 = *(uint *)(lVar3 + 0x38);
      lVar9 = (long)(int)uVar1;
      XFree(lVar3);
      uVar5 = 0xffffffffffffffff;
      if (-1 < lVar9) {
        uVar5 = lVar9 << 4;
      }
      puVar4 = (ulong *)operator_new__(uVar5);
      uVar5 = 0;
      uVar7 = 0;
      puVar8 = puVar4;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        *puVar8 = uVar5;
        puVar8 = puVar8 + 2;
      }
      XQueryColors(this->screen->display,this->screen->colormap,puVar4,uVar1);
      fVar14 = (float)(int)((uint)c->red - (uint)(ushort)puVar4[1]);
      fVar12 = (float)(int)((uint)c->green - (uint)*(ushort *)((long)puVar4 + 10));
      fVar13 = (float)(int)((uint)c->blue - (uint)*(ushort *)((long)puVar4 + 0xc));
      fVar12 = fVar13 * fVar13 + fVar14 * fVar14 + fVar12 * fVar12;
      puVar10 = (ushort *)((long)puVar4 + 0x1c);
      uVar5 = 0;
      for (; (long)uVar11 < lVar9; uVar11 = uVar11 + 1) {
        fVar13 = (float)(int)((uint)c->red - (uint)puVar10[-2]);
        fVar14 = (float)(int)((uint)c->green - (uint)puVar10[-1]);
        fVar15 = (float)(int)((uint)c->blue - (uint)*puVar10);
        fVar13 = fVar15 * fVar15 + fVar13 * fVar13 + fVar14 * fVar14;
        if (fVar13 < fVar12) {
          uVar5 = uVar11 & 0xffffffff;
          fVar12 = fVar13;
        }
        puVar10 = puVar10 + 8;
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"   Wanted r");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,c->red);
      poVar6 = std::operator<<(poVar6,", g");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,c->green);
      poVar6 = std::operator<<(poVar6,", b");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,c->blue);
      std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<((ostream *)&std::cerr,"   got    r");
      lVar3 = (long)(int)uVar5;
      lVar9 = lVar3 * 0x10;
      puVar8 = puVar4 + lVar3 * 2;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ushort)puVar4[lVar3 * 2 + 1]);
      poVar6 = std::operator<<(poVar6,", g");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(ushort *)((long)puVar4 + lVar9 + 10));
      poVar6 = std::operator<<(poVar6,", b");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(ushort *)((long)puVar4 + lVar9 + 0xc));
      std::operator<<(poVar6,"\n");
      fVar12 = (float)(int)((uint)c->red - (uint)(ushort)puVar4[lVar3 * 2 + 1]);
      fVar13 = (float)(int)((uint)c->green - (uint)*(ushort *)((long)puVar4 + lVar9 + 10));
      fVar14 = (float)(int)((uint)c->blue - (uint)*(ushort *)((long)puVar4 + lVar9 + 0xc));
      poVar6 = std::operator<<((ostream *)&std::cerr,"  Error = ");
      std::ostream::operator<<(poVar6,fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13);
      poVar6 = std::operator<<((ostream *)&std::cerr," error with cell i = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar5);
      std::endl<char,std::char_traits<char>>(poVar6);
      iVar2 = XAllocColor(this->screen->display,this->screen->colormap,puVar8);
      if (iVar2 == 0) {
        Paint_It_Black(c,this->screen->display,this->screen->colormap);
      }
      else {
        uVar11 = puVar8[1];
        c->pixel = *puVar8;
        c->red = (short)uVar11;
        c->green = (short)(uVar11 >> 0x10);
        c->blue = (short)(uVar11 >> 0x20);
        c->flags = (char)(uVar11 >> 0x30);
        c->pad = (char)(uVar11 >> 0x38);
      }
      operator_delete__(puVar4);
    }
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Allocate_Closest_Color(XColor &c) const
{
  // if we have a match, do no work.
  if (XAllocColor(screen->display, screen->colormap, &c))
    return;

  static int flag = 0;
  if (!flag) {
    std::cerr << "** No color cells left; using closest match.\n";
    flag = 1;
  }

  // X manual claims that the following 7 or so lines of code are only
  // slightly less convenient than just using "V->colormap_size" which
  // isn't allowed in case they change the Visual structure.  Crap.
  Visual *V = DefaultVisual(screen->display, screen->screen_number);
  VisualID vid = XVisualIDFromVisual(V);
  XVisualInfo vit; // template
  vit.visualid = vid;
  int n;
  XVisualInfo *vi = XGetVisualInfo(screen->display, VisualIDMask, &vit, &n);
  if (n == 0) {
    std::cerr
        << "** X Error finding closest color match.  Using Black instead.\n";
    XFree(vi);
    Paint_It_Black(c, screen->display, screen->colormap);
    return;
  }
  int n_colors = vi->colormap_size;
  XFree(vi);

  int i;
  XColor *colors = new XColor[n_colors];
  // fill the array with pixel values we want the rgb's for.
  for (i = 0; i < n_colors; i++)
    colors[i].pixel = i;
  XQueryColors(screen->display, screen->colormap, colors, n_colors);
#if defined(_M_UNIX)
  float *ecolors = new float[n_colors];
  // Compute error colors for color table
  for (i = 0; i < n_colors; i++)
    ecolors[i] = color_error(c.red, colors[i].red, c.green, colors[i].green,
                             c.blue, colors[i].blue);
  // Sort array by base in error color
  for (i = 0; i < n_colors; i++) {
    int j;
    for (j = i + 1; j < n_colors; j++)
      if (ecolors[i] > ecolors[j]) {
        float t = ecolors[i];
        ecolors[i] = ecolors[j];
        ecolors[j] = t;
        XColor ct = colors[i];
        colors[i] = colors[j];
        colors[j] = ct;
      }
    if (XAllocColor(screen->display, screen->colormap, &colors[i])) {
      c = colors[i];
      delete[] ecolors;
      delete[] colors;
      return;
    }
  }
  Paint_It_Black(c, screen->display, screen->colormap);
  delete[] ecolors;
  delete[] colors;
#else
  float e;
  int index_of_min = 0;
  float min_error =
      color_error(c.red, colors[0].red, c.green, colors[0].green, c.blue,
                  colors[0].blue); // so we don't recalculate
  for (i = 1; i < n_colors; i++) { // skip cell 0: default values.
    e = color_error(c.red, colors[i].red, c.green, colors[i].green, c.blue,
                    colors[i].blue);
    if (e < min_error) {
      index_of_min = i;
      min_error = e;
    }
  }
  std::cerr << "   Wanted r" << c.red << ", g" << c.green << ", b" << c.blue
            << "\n";
  std::cerr << "   got    r" << colors[index_of_min].red << ", g"
            << colors[index_of_min].green << ", b" << colors[index_of_min].blue
            << "\n";
  e = color_error(c.red, colors[index_of_min].red, c.green,
                  colors[index_of_min].green, c.blue,
                  colors[index_of_min].blue);
  std::cerr << "  Error = " << e;
  e = color_error(c.red, colors[i].red, c.green, colors[i].green, c.blue,
                  colors[i].blue);
  std::cerr << " error with cell i = " << index_of_min << std::endl;
  if (XAllocColor(screen->display, screen->colormap, &colors[index_of_min]))
    c = colors[index_of_min];
  else
    Paint_It_Black(c, screen->display, screen->colormap);
  delete[] colors;
#endif
}